

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O3

bool __thiscall DynamicGraph::checkComponentBreak(DynamicGraph *this,Vertex *v,Vertex *u)

{
  ulong uVar1;
  pointer puVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  allocator_type *paVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  unsigned_long uVar8;
  allocator_type *paVar9;
  ulong uVar10;
  AdjList *g;
  list<unsigned_long,_std::allocator<unsigned_long>_> visitedListV;
  list<unsigned_long,_std::allocator<unsigned_long>_> visitedListU;
  list<unsigned_long,_std::allocator<unsigned_long>_> queueU;
  list<unsigned_long,_std::allocator<unsigned_long>_> queueV;
  _List_node_base local_e0;
  long local_d0;
  allocator_type *local_c8;
  allocator_type *local_c0;
  long local_b8;
  vector<bool,_std::allocator<bool>_> local_b0;
  vector<bool,_std::allocator<bool>_> local_88;
  _List_node_base local_60;
  long local_50;
  _List_node_base local_48;
  long local_38;
  
  local_48._M_next = &local_48;
  local_38 = 0;
  local_60._M_next = &local_60;
  local_50 = 0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  local_60._M_prev = local_60._M_next;
  local_48._M_prev = local_48._M_next;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_b0,
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_88,
             (allocator_type *)&local_e0);
  local_e0._M_next = (_List_node_base *)((ulong)local_e0._M_next & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_88,
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_UndirectedGraph).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_e0,
             (allocator_type *)&local_c8);
  local_d0 = 0;
  local_b8 = 0;
  uVar1 = *v;
  uVar10 = uVar1 + 0x3f;
  if (-1 < (long)uVar1) {
    uVar10 = uVar1;
  }
  local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p
  [((long)uVar10 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p
       [((long)uVar10 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
       1L << ((byte)uVar1 & 0x3f);
  uVar1 = *u;
  uVar10 = uVar1 + 0x3f;
  if (-1 < (long)uVar1) {
    uVar10 = uVar1;
  }
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p
  [((long)uVar10 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p
       [((long)uVar10 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
       1L << ((byte)uVar1 & 0x3f);
  local_e0._M_next = &local_e0;
  local_e0._M_prev = &local_e0;
  local_c8 = (allocator_type *)&local_c8;
  local_c0 = (allocator_type *)&local_c8;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)*v;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_38 = local_38 + 1;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)*u;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_50 = local_50 + 1;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)*v;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_d0 = local_d0 + 1;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)*u;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  local_b8 = local_b8 + 1;
  while( true ) {
    bVar4 = local_60._M_next == &local_60 || local_48._M_next == &local_48;
    paVar5 = local_c8;
    if ((((bVar4) || (this->halt != false)) ||
        (bVar6 = bdbfsStep(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                           &local_b0,&local_88,
                           (list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e0),
        paVar5 = local_c8, !bVar6)) || (this->halt != false)) goto joined_r0x0010ba55;
    if (local_48._M_next == &local_48) break;
    bVar6 = bdbfsStep(this,(list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                      &local_88,&local_b0,
                      (list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8);
    paVar5 = local_c8;
    if ((!bVar6) || (this->halt != false)) goto joined_r0x0010ba55;
    if (local_60._M_next == &local_60) {
      this->halt = true;
      uVar8 = this->nextComponent + 1;
      this->nextComponent = uVar8;
      bVar4 = true;
      if (local_c8 != (allocator_type *)&local_c8) {
        puVar2 = (this->components).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar9 = local_c8;
        do {
          puVar2[*(long *)(paVar9 + 0x10)] = uVar8;
          paVar9 = *(allocator_type **)paVar9;
        } while (paVar9 != (allocator_type *)&local_c8);
      }
joined_r0x0010ba55:
      while (p_Var7 = local_e0._M_next, paVar5 != (allocator_type *)&local_c8) {
        paVar9 = *(allocator_type **)paVar5;
        operator_delete(paVar5,0x18);
        paVar5 = paVar9;
      }
      while (p_Var7 != &local_e0) {
        p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var7->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var7,0x18);
        p_Var7 = p_Var3;
      }
      if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
      }
      p_Var7 = local_60._M_next;
      if (local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        p_Var7 = local_60._M_next;
      }
      while (p_Var3 = local_48._M_next, p_Var7 != &local_60) {
        p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var7->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var7,0x18);
        p_Var7 = p_Var3;
      }
      while (p_Var3 != &local_48) {
        p_Var7 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var3->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var3,0x18);
        p_Var3 = p_Var7;
      }
      return bVar4;
    }
  }
  this->halt = true;
  uVar8 = this->nextComponent + 1;
  this->nextComponent = uVar8;
  bVar4 = true;
  if (local_e0._M_next != &local_e0) {
    puVar2 = (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    p_Var7 = local_e0._M_next;
    do {
      puVar2[(long)p_Var7[1]._M_next] = uVar8;
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != &local_e0);
  }
  goto joined_r0x0010ba55;
}

Assistant:

bool DynamicGraph::checkComponentBreak(const Vertex &v, const Vertex &u)
{
    std::list<Vertex> queueV;
    std::list<Vertex> queueU;
    std::vector<bool> visitedV(boost::num_vertices(*this), false);
    std::vector<bool> visitedU(boost::num_vertices(*this), false);
    std::list<Vertex> visitedListV;
    std::list<Vertex> visitedListU;

    // Using bidirectional BFS
    visitedV[v]=true;
    visitedU[u]=true;
    queueV.push_back(v);
    queueU.push_back(u);
    visitedListV.push_back(v);
    visitedListU.push_back(u);
    while(!queueV.empty() && !queueU.empty()) {
        if (this->halt) {
            return false;
        }

        if(!this->bdbfsStep(queueV, visitedV, visitedU, visitedListV)
           || this->halt) {
            return false;
        }

        if (queueV.empty()) {
            this->halt = true;
            updateVisitedComponents(visitedListV);
            break;
        }

        if(!this->bdbfsStep(queueU, visitedU, visitedV, visitedListU)
           || this->halt) {
            return false;
        }

        if (queueU.empty()) {
            this->halt = true;
            updateVisitedComponents(visitedListU);
            break;
        }
    }
    return true;
}